

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffect.cpp
# Opt level: O2

void Rml::FontEffect::FillColorValuesFromAlpha(byte *destination,Vector2i dimensions,int stride)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  uVar3 = 0;
  uVar6 = 0;
  if (0 < dimensions.x) {
    uVar6 = (ulong)dimensions & 0xffffffff;
  }
  uVar2 = (ulong)dimensions >> 0x20;
  if (dimensions.y == 0 || (long)dimensions < 0) {
    uVar2 = uVar3;
  }
  pbVar5 = destination + 3;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      bVar1 = pbVar5[uVar4 * 4];
      pbVar5[uVar4 * 4 + -1] = bVar1;
      pbVar5[uVar4 * 4 + -2] = bVar1;
      pbVar5[uVar4 * 4 + -3] = bVar1;
    }
    pbVar5 = pbVar5 + stride;
  }
  return;
}

Assistant:

void FontEffect::FillColorValuesFromAlpha(byte* destination, Vector2i dimensions, int stride)
{
	for (int y = 0; y < dimensions.y; ++y)
	{
		for (int x = 0; x < dimensions.x; ++x)
		{
			const int i = y * stride + x * 4;
			const byte alpha = destination[i + 3];
			destination[i + 0] = destination[i + 1] = destination[i + 2] = alpha;
		}
	}
}